

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkerFlow.cpp
# Opt level: O3

bool __thiscall WorkerFlow::recv_notif(WorkerFlow *this)

{
  int iVar1;
  string *this_00;
  int *piVar2;
  char *pcVar3;
  bool bVar4;
  allocator<char> local_11;
  
  iVar1 = zmq_recv(this->m_notif_socket,this->m_buffer,this->m_buffsize,0);
  if (iVar1 != -1) {
    this->m_buffer[iVar1] = '\0';
    pcVar3 = this->m_buffer;
    bVar4 = true;
    if ((*pcVar3 == '#') && (pcVar3[1] == '\\')) {
      bVar4 = pcVar3[2] != '\0';
    }
    return bVar4;
  }
  this_00 = (string *)__cxa_allocate_exception(0x20);
  piVar2 = __errno_location();
  pcVar3 = strerror(*piVar2);
  std::__cxx11::string::string<std::allocator<char>>(this_00,pcVar3,&local_11);
  __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

bool WorkerFlow::recv_notif()
{
    // Receive a message from the notification channel
    int size = zmq_recv(m_notif_socket, m_buffer, m_buffsize, 0);
    if (size == -1) {
        throw std::string(strerror(errno));
    }

    // set the last byte to 0 to terminate the buffer correctly. This value
    // should be never seen by others.
    m_buffer[size] = 0;

    // For now, we only support __EndOfTransmission__ message
    // This must be extendable and standarized!
    if (strcmp(m_buffer, "#\\") == 0) {
        return false;
    }

    // Other message is not considered
    return true;
}